

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

bool IsFileInDir(string *infile,string *indir)

{
  int iVar1;
  bool bVar2;
  string dir;
  string file;
  string local_68;
  string local_48;
  long *local_28;
  size_t local_20;
  long local_18 [2];
  
  cmsys::SystemTools::CollapseFullPath(&local_48,infile);
  cmsys::SystemTools::CollapseFullPath(&local_68,indir);
  if (local_48._M_string_length <= local_68._M_string_length) {
    bVar2 = false;
    goto LAB_00280622;
  }
  std::__cxx11::string::substr((ulong)&local_28,(ulong)&local_48);
  if (local_20 == local_68._M_string_length) {
    if (local_20 != 0) {
      iVar1 = bcmp(local_28,local_68._M_dataplus._M_p,local_20);
      if (iVar1 != 0) goto LAB_002805f3;
    }
    bVar2 = local_48._M_dataplus._M_p[local_20] == '/';
  }
  else {
LAB_002805f3:
    bVar2 = false;
  }
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
LAB_00280622:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool IsFileInDir(const std::string &infile, const std::string &indir)
{
  std::string file = cmSystemTools::CollapseFullPath(infile);
  std::string dir = cmSystemTools::CollapseFullPath(indir);

  if (
    file.size() > dir.size() &&
    (fnc(file.substr(0, dir.size())) == fnc(dir)) &&
    file[dir.size()] == '/'
    )
    {
    return true;
    }

  return false;
}